

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool __thiscall pbrt::SquareMatrix<2>::operator<(SquareMatrix<2> *this,SquareMatrix<2> *m2)

{
  ulong uVar1;
  byte in_CL;
  float fVar2;
  float fVar3;
  
  uVar1 = 0;
  do {
    if (uVar1 == 2) {
LAB_003111a0:
      return (bool)(uVar1 < 2 & in_CL);
    }
    fVar2 = this->m[uVar1][0];
    fVar3 = m2->m[uVar1][0];
    if (fVar2 != fVar3) {
LAB_00311199:
      in_CL = fVar2 < fVar3;
      goto LAB_003111a0;
    }
    fVar2 = this->m[uVar1][1];
    fVar3 = m2->m[uVar1][1];
    if (fVar2 != fVar3) goto LAB_00311199;
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }